

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

string * __thiscall
cmsys::SystemInformation::GetFullyQualifiedDomainName_abi_cxx11_
          (string *__return_storage_ptr__,SystemInformation *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  SystemInformationImplementation::GetFullyQualifiedDomainName
            ((SystemInformationImplementation *)__return_storage_ptr__,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemInformation::GetFullyQualifiedDomainName()
{
  std::string fqdn;
  this->Implementation->GetFullyQualifiedDomainName(fqdn);
  return fqdn;
}